

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O3

bool __thiscall
ddd::DaTrie<true,_false,_false>::insert_key(DaTrie<true,_false,_false> *this,Query *query)

{
  pointer pBVar1;
  bool bVar2;
  
  if ((this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    fix_(this,0,&this->blocks_);
    pBVar1 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
             super__Vector_impl_data._M_start;
    *pBVar1 = (Bc)((ulong)*pBVar1 | 0x7fffffff00000000);
  }
  else {
    bVar2 = search_key(this,query);
    if (bVar2) {
      return false;
    }
    if (((this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
         super__Vector_impl_data._M_start[query->node_pos_].field_0x3 & 0x80) == 0) {
      insert_edge_(this,query);
    }
    else {
      insert_branch_(this,query);
    }
  }
  insert_tail_(this,query);
  return true;
}

Assistant:

bool insert_key(Query& query) {
    assert(!Prefix);

    if (bc_.empty()) { // first insert
      fix_(ROOT_POS, blocks_);
      bc_[ROOT_POS].set_check(INVALID_VALUE);
      insert_tail_(query);
      return true;
    }

    if (search_key(query)) {
      return false;
    }

    bc_[query.node_pos()].is_leaf() ? insert_branch_(query) : insert_edge_(query);
    insert_tail_(query);
    return true;
  }